

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O2

UniquePtr<const_StyleSheetContainer> __thiscall
Rml::StyleSheetFactory::LoadStyleSheetContainer(StyleSheetFactory *this,String *sheet)

{
  bool bVar1;
  String *in_RDX;
  pointer __old_p;
  UniquePtr<Rml::StreamFile> stream;
  StyleSheetContainer *local_28;
  
  ::std::make_unique<Rml::StreamFile>();
  bVar1 = StreamFile::Open((StreamFile *)
                           stream._M_t.
                           super___uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>
                           .super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl,in_RDX);
  if (bVar1) {
    ::std::make_unique<Rml::StyleSheetContainer>();
    bVar1 = StyleSheetContainer::LoadStyleSheetContainer
                      (local_28,(Stream *)
                                stream._M_t.
                                super___uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>
                                .super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl,1);
    if (bVar1) goto LAB_002cbda2;
    (*local_28->_vptr_StyleSheetContainer[1])(local_28);
  }
  local_28 = (StyleSheetContainer *)0x0;
LAB_002cbda2:
  (this->stylesheets).mKeyVals = (Node *)local_28;
  ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::~unique_ptr(&stream);
  return (__uniq_ptr_data<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>,_true,_true>
          )(__uniq_ptr_data<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>,_true,_true>
            )this;
}

Assistant:

UniquePtr<const StyleSheetContainer> StyleSheetFactory::LoadStyleSheetContainer(const String& sheet)
{
	UniquePtr<StyleSheetContainer> new_style_sheet;

	// Open stream, construct new sheet and pass the stream into the sheet
	auto stream = MakeUnique<StreamFile>();
	if (stream->Open(sheet))
	{
		new_style_sheet = MakeUnique<StyleSheetContainer>();
		if (!new_style_sheet->LoadStyleSheetContainer(stream.get()))
		{
			new_style_sheet.reset();
		}
	}

	return new_style_sheet;
}